

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
InterpreterTest_ShrSI32_Test::~InterpreterTest_ShrSI32_Test(InterpreterTest_ShrSI32_Test *this)

{
  InterpreterTest_ShrSI32_Test *this_local;
  
  ~InterpreterTest_ShrSI32_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(InterpreterTest, ShrSI32) {
  Module wasm;
  IRBuilder builder(wasm);

  ASSERT_FALSE(builder.makeConst(Literal(uint32_t(1))).getErr());
  ASSERT_FALSE(builder.makeConst(Literal(uint32_t(2))).getErr());
  ASSERT_FALSE(builder.makeBinary(ShrSInt32).getErr());

  auto expr = builder.build();
  ASSERT_FALSE(expr.getErr());

  auto results = Interpreter{}.runTest(*expr);
  std::vector<Literal> expected{Literal(uint32_t(0))};

  EXPECT_EQ(results, expected);
}